

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,StringTree *rest,
          ArrayPtr<const_char> *rest_1,StringTree *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,StringTree *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          ArrayPtr<const_char> *rest_10,StringTree *rest_11,ArrayPtr<const_char> *rest_12,
          String *rest_13,ArrayPtr<const_char> *rest_14,String *rest_15,
          ArrayPtr<const_char> *rest_16)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *rest_17;
  StringTree *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  StringTree *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  ArrayPtr<const_char> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  StringTree *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  String *rest_12_00;
  ArrayPtr<const_char> *rest_13_00;
  String *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  ArrayPtr<const_char> *rest_local_1;
  StringTree *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pSVar3 = fwd<kj::StringTree>(rest);
  rest_17 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::StringTree>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::StringTree>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::StringTree>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  rest_12_00 = fwd<kj::String>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::String>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pSVar3,rest_17,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}